

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_elements_address.cpp
# Opt level: O0

void __thiscall
ElementsAddressFactory_CreatePegInAddress2_Test::TestBody
          (ElementsAddressFactory_CreatePegInAddress2_Test *this)

{
  bool bVar1;
  CfdException *anon_var_0_1;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  Address address_1;
  ElementsAddressFactory factory_1;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Address address;
  ElementsAddressFactory factory;
  Script fedpegscript;
  Script claim_script;
  Address *this_00;
  AssertHelper local_7f0;
  Message local_7e8 [4];
  NetType in_stack_fffffffffffff83c;
  ElementsAddressFactory *in_stack_fffffffffffff840;
  Script *in_stack_fffffffffffff860;
  Script *in_stack_fffffffffffff868;
  AddressType in_stack_fffffffffffff874;
  ElementsAddressFactory *in_stack_fffffffffffff878;
  ConstCharPtr local_620;
  AssertHelper local_618;
  Message local_610 [53];
  AssertHelper local_468;
  Message local_460 [2];
  Script local_450 [7];
  byte local_299;
  ConstCharPtr local_298;
  AssertHelper local_290;
  Message local_288 [54];
  undefined1 local_d1 [145];
  Script local_40;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_d1 + 0x71),"76a914c3bec9f6c51c3d1f0fd00c54fe41b5d8014ed8eb88ac",
             (allocator *)((long)local_d1 + 0x70));
  cfd::core::Script::Script(&local_40,(string *)(local_d1 + 0x71));
  std::__cxx11::string::~string((string *)(local_d1 + 0x71));
  std::allocator<char>::~allocator((allocator<char> *)((long)local_d1 + 0x70));
  this_00 = (Address *)local_d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)((long)local_d1 + 1),
             "522102baae8e066e4f2a1da4b731017697bb8fcacc60e4569f3ec27bc31cf3fb13246221026bccd050e8ecf7a702bc9fb63205cfdf278a22ba8b1f1d3ca3d8e5b38465a9702103430d354b89d1fbe43eb54ea138a4aee1076e4c54f4c805f62f9cee965351a1d053ae"
             ,(allocator *)this_00);
  cfd::core::Script::Script((Script *)((long)local_d1 + 0x21),(string *)((long)local_d1 + 1));
  std::__cxx11::string::~string((string *)((long)local_d1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_d1);
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (in_stack_fffffffffffff840,in_stack_fffffffffffff83c);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ElementsAddressFactory::CreatePegInAddress
                (in_stack_fffffffffffff878,in_stack_fffffffffffff874,in_stack_fffffffffffff868,
                 in_stack_fffffffffffff860);
      cfd::core::Address::~Address(this_00);
    }
  }
  else {
    testing::Message::Message(local_288);
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x118,
               "Expected: Address address = factory.CreatePegInAddress(AddressType::kP2wshAddress, claim_script, fedpegscript) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_290,local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    testing::Message::~Message((Message *)0x1f92f3);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_298,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_298);
  if (bVar1) {
    local_299 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Script::Script(local_450);
      cfd::ElementsAddressFactory::CreatePegInAddress
                (in_stack_fffffffffffff878,in_stack_fffffffffffff874,in_stack_fffffffffffff868,
                 in_stack_fffffffffffff860);
      cfd::core::Address::~Address(this_00);
      cfd::core::Script::~Script((Script *)this_00);
    }
    if ((local_299 & 1) != 0) goto LAB_001f9562;
    local_298.value =
         "Expected: factory.CreatePegInAddress(AddressType::kP2wshAddress, Script(), fedpegscript) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_460);
  testing::internal::AssertHelper::AssertHelper
            (&local_468,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
             ,0x11b,local_298.value);
  testing::internal::AssertHelper::operator=(&local_468,local_460);
  testing::internal::AssertHelper::~AssertHelper(&local_468);
  testing::Message::~Message((Message *)0x1f9517);
LAB_001f9562:
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f956f);
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (in_stack_fffffffffffff840,in_stack_fffffffffffff83c);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ElementsAddressFactory::CreatePegInAddress
                (in_stack_fffffffffffff878,in_stack_fffffffffffff874,in_stack_fffffffffffff868,
                 in_stack_fffffffffffff860);
      cfd::core::Address::~Address(this_00);
    }
  }
  else {
    testing::Message::Message(local_610);
    testing::internal::AssertHelper::AssertHelper
              (&local_618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x11f,
               "Expected: Address address = factory.CreatePegInAddress(AddressType::kP2wshAddress, claim_script, fedpegscript) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_618,local_610);
    testing::internal::AssertHelper::~AssertHelper(&local_618);
    testing::Message::~Message((Message *)0x1f96be);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_620,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_620);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Script::Script((Script *)(local_7e8 + 2));
      cfd::ElementsAddressFactory::CreatePegInAddress
                (in_stack_fffffffffffff878,in_stack_fffffffffffff874,in_stack_fffffffffffff868,
                 in_stack_fffffffffffff860);
      cfd::core::Address::~Address(this_00);
      cfd::core::Script::~Script((Script *)this_00);
    }
    local_620.value =
         "Expected: factory.CreatePegInAddress(AddressType::kP2wshAddress, Script(), fedpegscript) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_7e8);
  testing::internal::AssertHelper::AssertHelper
            (&local_7f0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
             ,0x122,local_620.value);
  testing::internal::AssertHelper::operator=(&local_7f0,local_7e8);
  testing::internal::AssertHelper::~AssertHelper(&local_7f0);
  testing::Message::~Message((Message *)0x1f98b9);
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f9908);
  cfd::core::Script::~Script((Script *)this_00);
  cfd::core::Script::~Script((Script *)this_00);
  return;
}

Assistant:

TEST(ElementsAddressFactory, CreatePegInAddress2)
{
  Script claim_script("76a914c3bec9f6c51c3d1f0fd00c54fe41b5d8014ed8eb88ac");
  Script fedpegscript("522102baae8e066e4f2a1da4b731017697bb8fcacc60e4569f3ec27bc31cf3fb13246221026bccd050e8ecf7a702bc9fb63205cfdf278a22ba8b1f1d3ca3d8e5b38465a9702103430d354b89d1fbe43eb54ea138a4aee1076e4c54f4c805f62f9cee965351a1d053ae");
  {
    ElementsAddressFactory factory(NetType::kMainnet);
    EXPECT_NO_THROW(Address address = factory.CreatePegInAddress(AddressType::kP2wshAddress, claim_script, fedpegscript));
    // error
    // EXPECT_THROW(factory.CreatePegInAddress(AddressType::kP2wshAddress, claim_script, Script()), CfdException);
    EXPECT_THROW(factory.CreatePegInAddress(AddressType::kP2wshAddress, Script(), fedpegscript), CfdException);
  }
  {
    ElementsAddressFactory factory(NetType::kRegtest);
    EXPECT_NO_THROW(Address address = factory.CreatePegInAddress(AddressType::kP2wshAddress, claim_script, fedpegscript));
    // error
    // EXPECT_THROW(factory.CreatePegInAddress(AddressType::kP2wshAddress, claim_script, Script()), CfdException);
    EXPECT_THROW(factory.CreatePegInAddress(AddressType::kP2wshAddress, Script(), fedpegscript), CfdException);
  }
}